

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re.c
# Opt level: O1

int matchpattern(regex_t *pattern,char *text,int *matchlength)

{
  byte bVar1;
  uchar uVar2;
  anon_union_8_2_c9599718_for_u aVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  char *prepoint;
  regex_t *pattern_00;
  regex_t p;
  regex_t p_00;
  regex_t p_01;
  regex_t p_02;
  
  iVar6 = *matchlength;
  pattern_00 = pattern + 2;
  do {
    bVar1 = pattern_00[-2].type;
    if (bVar1 == 0) {
LAB_00116928:
      if (bVar1 == 0) {
        return 1;
      }
      aVar3 = (anon_union_8_2_c9599718_for_u)pattern_00[-2].u.ccl;
      iVar6 = matchpattern(pattern_00,text,matchlength);
      if (iVar6 != 0) {
        return 1;
      }
      if (*text == '\0') {
        return 0;
      }
      p_00._1_7_ = 0;
      p_00.type = bVar1;
      p_00.u = (anon_union_8_2_c9599718_for_u)(anon_union_8_2_c9599718_for_u)aVar3.ccl;
      iVar6 = matchone(p_00,*text);
      if (iVar6 != 0) {
        iVar6 = matchpattern(pattern_00,text + 1,matchlength);
        if (iVar6 != 0) {
          *matchlength = *matchlength + 1;
          return 1;
        }
        return 0;
      }
      return 0;
    }
    uVar2 = pattern_00[-1].type;
    if (uVar2 == '\x06') {
      cVar4 = *text;
      pcVar7 = text;
      if (cVar4 == '\0') goto LAB_001169d3;
      aVar3 = (anon_union_8_2_c9599718_for_u)pattern_00[-2].u.ccl;
      goto LAB_001169b1;
    }
    if (uVar2 == '\x05') {
      iVar6 = *matchlength;
      cVar4 = *text;
      pcVar7 = text;
      if (cVar4 == '\0') goto LAB_00116a4c;
      aVar3 = (anon_union_8_2_c9599718_for_u)pattern_00[-2].u.ccl;
      goto LAB_00116a10;
    }
    if (uVar2 == '\x04') goto LAB_00116928;
    if (bVar1 == 3 && uVar2 == '\0') {
      return (uint)(*text == '\0');
    }
    *matchlength = *matchlength + 1;
    cVar4 = *text;
    if (cVar4 == '\0') break;
    text = text + 1;
    p._4_4_ = 0;
    p.type = pattern_00[-2].type;
    p._1_3_ = *(undefined3 *)&pattern_00[-2].field_0x1;
    p.u.ccl = pattern_00[-2].u.ccl;
    iVar5 = matchone(p,cVar4);
    pattern_00 = pattern_00 + 1;
  } while (iVar5 != 0);
  *matchlength = iVar6;
  return 0;
  while( true ) {
    *matchlength = *matchlength + 1;
    cVar4 = pcVar7[1];
    pcVar7 = pcVar7 + 1;
    if (cVar4 == '\0') break;
LAB_001169b1:
    p_01._1_7_ = 0;
    p_01.type = bVar1;
    p_01.u = (anon_union_8_2_c9599718_for_u)(anon_union_8_2_c9599718_for_u)aVar3.ccl;
    iVar6 = matchone(p_01,cVar4);
    if (iVar6 == 0) break;
  }
LAB_001169d3:
  while( true ) {
    if (pcVar7 <= text) {
      return 0;
    }
    iVar6 = matchpattern(pattern_00,pcVar7,matchlength);
    if (iVar6 != 0) break;
    *matchlength = *matchlength + -1;
    pcVar7 = pcVar7 + -1;
  }
  return 1;
  while( true ) {
    *matchlength = *matchlength + 1;
    cVar4 = pcVar7[1];
    pcVar7 = pcVar7 + 1;
    if (cVar4 == '\0') break;
LAB_00116a10:
    p_02._1_7_ = 0;
    p_02.type = bVar1;
    p_02.u = (anon_union_8_2_c9599718_for_u)(anon_union_8_2_c9599718_for_u)aVar3.ccl;
    iVar5 = matchone(p_02,cVar4);
    if (iVar5 == 0) break;
  }
LAB_00116a4c:
  while( true ) {
    if (pcVar7 < text) {
      *matchlength = iVar6;
      return 0;
    }
    iVar5 = matchpattern(pattern_00,pcVar7,matchlength);
    if (iVar5 != 0) break;
    pcVar7 = pcVar7 + -1;
    *matchlength = *matchlength + -1;
  }
  return 1;
}

Assistant:

static int matchpattern(regex_t* pattern, const char* text, int* matchlength)
{
  int pre = *matchlength;
  do
  {
    if ((pattern[0].type == UNUSED) || (pattern[1].type == QUESTIONMARK))
    {
      return matchquestion(pattern[0], &pattern[2], text, matchlength);
    }
    else if (pattern[1].type == STAR)
    {
      return matchstar(pattern[0], &pattern[2], text, matchlength);
    }
    else if (pattern[1].type == PLUS)
    {
      return matchplus(pattern[0], &pattern[2], text, matchlength);
    }
    else if ((pattern[0].type == END) && pattern[1].type == UNUSED)
    {
      return (text[0] == '\0');
    }
/*  Branching is not working properly
    else if (pattern[1].type == BRANCH)
    {
      return (matchpattern(pattern, text) || matchpattern(&pattern[2], text));
    }
*/
  (*matchlength)++;
  }
  while ((text[0] != '\0') && matchone(*pattern++, *text++));

  *matchlength = pre;
  return 0;
}